

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * despot::util::tinyxml::TiXmlBase::ReadText
                 (char *p,TiXmlString *text,bool trimWhiteSpace,char *endTag,bool caseInsensitive,
                 TiXmlEncoding encoding)

{
  bool bVar1;
  size_t sVar2;
  byte local_46;
  byte local_45;
  char local_44 [4];
  int local_40;
  char cArr_1 [4];
  int len_1;
  int iStack_34;
  bool whitespace;
  char cArr [4];
  int len;
  TiXmlEncoding encoding_local;
  bool caseInsensitive_local;
  char *endTag_local;
  bool trimWhiteSpace_local;
  TiXmlString *text_local;
  char *p_local;
  
  cArr = (char  [4])encoding;
  TiXmlString::operator=(text,"");
  text_local = (TiXmlString *)p;
  if ((trimWhiteSpace) && ((condenseWhiteSpace & 1) != 0)) {
    cArr_1[3] = '\0';
    text_local = (TiXmlString *)SkipWhiteSpace(p,(TiXmlEncoding)cArr);
    while( true ) {
      local_46 = 0;
      if ((text_local != (TiXmlString *)0x0) && (local_46 = 0, *(char *)&text_local->rep_ != '\0'))
      {
        bVar1 = StringEqual((char *)text_local,endTag,caseInsensitive,(TiXmlEncoding)cArr);
        local_46 = bVar1 ^ 0xff;
      }
      if ((local_46 & 1) == 0) break;
      if ((*(char *)&text_local->rep_ == '\r') || (*(char *)&text_local->rep_ == '\n')) {
        cArr_1[3] = '\x01';
        text_local = (TiXmlString *)((long)&text_local->rep_ + 1);
      }
      else {
        bVar1 = IsWhiteSpace(*(char *)&text_local->rep_);
        if (bVar1) {
          cArr_1[3] = '\x01';
          text_local = (TiXmlString *)((long)&text_local->rep_ + 1);
        }
        else {
          if ((cArr_1[3] & 1U) != 0) {
            TiXmlString::operator+=(text,' ');
            cArr_1[3] = '\0';
          }
          memset(local_44,0,4);
          text_local = (TiXmlString *)
                       GetChar((char *)text_local,local_44,&local_40,(TiXmlEncoding)cArr);
          if (local_40 == 1) {
            TiXmlString::operator+=(text,local_44[0]);
          }
          else {
            TiXmlString::append(text,local_44,(long)local_40);
          }
        }
      }
    }
  }
  else {
    while( true ) {
      local_45 = 0;
      if ((text_local != (TiXmlString *)0x0) && (local_45 = 0, *(char *)&text_local->rep_ != '\0'))
      {
        bVar1 = StringEqual((char *)text_local,endTag,caseInsensitive,(TiXmlEncoding)cArr);
        local_45 = bVar1 ^ 0xff;
      }
      if ((local_45 & 1) == 0) break;
      memset(&len_1,0,4);
      text_local = (TiXmlString *)
                   GetChar((char *)text_local,(char *)&len_1,&stack0xffffffffffffffcc,
                           (TiXmlEncoding)cArr);
      TiXmlString::append(text,(char *)&len_1,(long)iStack_34);
    }
  }
  if (text_local != (TiXmlString *)0x0) {
    sVar2 = strlen(endTag);
    text_local = (TiXmlString *)((long)&text_local->rep_ + sVar2);
  }
  return (char *)text_local;
}

Assistant:

const char* TiXmlBase::ReadText(const char* p, TIXML_STRING * text,
	bool trimWhiteSpace, const char* endTag, bool caseInsensitive,
	TiXmlEncoding encoding) {
	*text = "";
	if (!trimWhiteSpace // certain tags always keep whitespace
	|| !condenseWhiteSpace) // if true, whitespace is always kept
		{
		// Keep all the white space.
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			int len;
			char cArr[4] = { 0, 0, 0, 0 };
			p = GetChar(p, cArr, &len, encoding);
			text->append(cArr, len);
		}
	} else {
		bool whitespace = false;

		// Remove leading white space:
		p = SkipWhiteSpace(p, encoding);
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			if (*p == '\r' || *p == '\n') {
				whitespace = true;
				++p;
			} else if (IsWhiteSpace(*p)) {
				whitespace = true;
				++p;
			} else {
				// If we've found whitespace, add it before the
				// new character. Any whitespace just becomes a space.
				if (whitespace) {
					(*text) += ' ';
					whitespace = false;
				}
				int len;
				char cArr[4] = { 0, 0, 0, 0 };
				p = GetChar(p, cArr, &len, encoding);
				if (len == 1)
					(*text) += cArr[0]; // more efficient
				else
					text->append(cArr, len);
			}
		}
	}
	if (p)
		p += strlen(endTag);
	return p;
}